

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

EAMType __thiscall OpenMD::EAMAdapter::getEAMType(EAMAdapter *this)

{
  EAMParameters eamParam;
  EAMAdapter *in_stack_00000088;
  undefined4 local_38;
  
  getEAMParam(in_stack_00000088);
  EAMParameters::~EAMParameters((EAMParameters *)0x29a53a);
  return local_38;
}

Assistant:

EAMType EAMAdapter::getEAMType() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.eamType;
  }